

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

MaterialHandle __thiscall
pbrt::MixMaterial::ChooseMaterial<pbrt::UniversalTextureEvaluator>
          (MixMaterial *this,undefined8 *param_2)

{
  undefined1 auVar1 [16];
  TextureEvalContext ctx;
  uintptr_t uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Float FVar6;
  undefined1 in_XMM2 [16];
  long in_stack_00000008;
  ulong in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  long in_stack_00000048;
  uint in_stack_00000050;
  UniversalTextureEvaluator local_19;
  undefined8 local_18;
  
  local_18 = *param_2;
  ctx._8_8_ = in_stack_00000010;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_00000008;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_00000018;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_00000020;
  ctx._32_8_ = in_stack_00000028;
  ctx._40_8_ = in_stack_00000030;
  ctx._48_8_ = in_stack_00000038;
  ctx._56_8_ = in_stack_00000040;
  FVar6 = UniversalTextureEvaluator::operator()(&local_19,(FloatTextureHandle)&local_18,ctx);
  if (FVar6 <= 0.0) {
    uVar2 = param_2[1];
  }
  else if (1.0 <= FVar6) {
    uVar2 = param_2[2];
  }
  else {
    uVar4 = param_2[2] * -0x395b586ca42e166b;
    uVar4 = ((uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) *
            -0x395b586ca42e166b;
    uVar5 = param_2[1] * -0x395b586ca42e166b;
    uVar4 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
    uVar4 = (uVar4 >> 0x2f ^ (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b ^ uVar4 ^
            0x35253c9ade8f4ca8) * -0x395b586ca42e166b;
    uVar4 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
    uVar4 = ((uVar4 >> 0x2f ^
              ((ulong)(in_stack_00000048 * -0x395b586ca42e166b) >> 0x2f ^
              in_stack_00000048 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ uVar4 ^
             0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b ^ (ulong)in_stack_00000050) *
            -0x395b586ca42e166b;
    uVar4 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
    uVar4 = ((uVar4 >> 0x2f ^
              ((ulong)(in_stack_00000008 * -0x395b586ca42e166b) >> 0x2f ^
              in_stack_00000008 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ uVar4 ^
             0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b ^ in_stack_00000010 & 0xffffffff) *
            -0x395b586ca42e166b;
    lVar3 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,(uint)((ulong)lVar3 >> 0x2f) ^ (uint)lVar3);
    uVar2 = param_2[2];
    if (FVar6 < (float)(auVar1._0_8_ * 2.3283064365386963e-10)) {
      uVar2 = param_2[1];
    }
  }
  (this->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = uVar2;
  return (MaterialHandle)
         (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          )this;
}

Assistant:

PBRT_CPU_GPU MaterialHandle ChooseMaterial(TextureEvaluator texEval,
                                               MaterialEvalContext ctx) const {
        Float amt = texEval(amount, ctx);
        if (amt <= 0)
            return materials[0];
        if (amt >= 1)
            return materials[1];

        Float u = uint32_t(Hash(ctx.p, ctx.wo, materials[0], materials[1])) * 0x1p-32;
        return (amt < u) ? materials[0] : materials[1];
    }